

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_indexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  float fVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pv;
  long lVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  int64_t iVar14;
  JSValueUnion JVar15;
  bool bVar16;
  float fVar17;
  JSValue JVar18;
  double d;
  int local_48;
  int local_44;
  double local_40;
  JSValueUnion local_38;
  
  local_38 = this_val.u;
  iVar3 = js_typed_array_get_length_internal(ctx,this_val);
  iVar14 = 6;
  if (iVar3 < 0) {
LAB_0016f71d:
    JVar15.float64 = 0.0;
    goto LAB_0016f920;
  }
  if (iVar3 == 0) goto switchD_0016f87e_default;
  if (special == 1) {
    iVar13 = iVar3 + -1;
    local_48 = iVar13;
    local_44 = special;
    if (argc < 2) {
LAB_0016f7db:
      lVar12 = -1;
      iVar13 = -1;
      special = local_44;
    }
    else {
      iVar4 = JS_ToFloat64(ctx,&local_40,argv[1]);
      if (iVar4 != 0) goto LAB_0016f71d;
      special = local_44;
      if (NAN(local_40)) {
        local_48 = 0;
        lVar12 = -1;
        iVar13 = -1;
      }
      else {
        lVar12 = -1;
        if (0.0 <= local_40) {
          if (local_40 < (double)iVar13) {
            local_48 = (int)local_40;
          }
          goto LAB_0016f7db;
        }
        uVar7 = 0xffffffff;
        if (local_40 + (double)iVar3 < 0.0) goto LAB_0016f904;
        local_48 = (int)(local_40 + (double)iVar3);
        iVar13 = -1;
      }
    }
  }
  else {
    local_48 = 0;
    lVar12 = 1;
    iVar13 = iVar3;
    if (1 < argc) {
      JVar15.float64 = 0.0;
      iVar4 = JS_ToInt32Clamp(ctx,&local_48,argv[1],0,iVar3,iVar3);
      lVar12 = 1;
      if (iVar4 != 0) goto LAB_0016f920;
    }
  }
  if (*(char *)(*(long *)(*(long *)(*(long *)((long)local_38.ptr + 0x30) + 0x18) + 0x30) + 4) !=
      '\0') {
    uVar7 = 0xffffffff;
    if (special == -1) {
      uVar7 = -(uint)((int)argv->tag != 3);
    }
    goto LAB_0016f904;
  }
  iVar4 = (int)argv->tag;
  if (iVar4 == 7) {
    local_40 = (argv->u).float64;
    uVar9 = (ulong)local_40;
    bVar11 = (double)(long)uVar9 == local_40;
  }
  else {
    if (iVar4 != 0) goto switchD_0016f87e_default;
    uVar9 = (ulong)(argv->u).int32;
    local_40 = (double)(argv->u).int32;
    bVar11 = true;
  }
  uVar8 = (uint)uVar9;
  switch(*(undefined2 *)((long)local_38.ptr + 6)) {
  case 0x15:
  case 0x17:
    bVar16 = uVar9 < 0x100;
    goto joined_r0x0016f8fd;
  case 0x16:
    bVar16 = (long)(char)uVar9 == uVar9;
joined_r0x0016f8fd:
    if ((bool)(bVar11 & bVar16)) {
      lVar10 = *(long *)((long)local_38.ptr + 0x38);
      if (special == 1) {
        uVar7 = 0xffffffff;
        if (local_48 != iVar13) {
          lVar5 = (long)local_48;
          do {
            if ((uVar8 & 0xffff) == (uint)*(byte *)(lVar10 + lVar5)) {
              uVar7 = (uint)lVar5;
              goto LAB_0016f904;
            }
            lVar5 = lVar5 + lVar12;
          } while (iVar13 != (int)lVar5);
          uVar7 = 0xffffffff;
        }
      }
      else {
        pvVar6 = memchr((void *)(lVar10 + local_48),uVar8 & 0xffff,(long)iVar3 - (long)local_48);
        uVar7 = 0xffffffff;
        if (pvVar6 != (void *)0x0) {
          uVar7 = (int)pvVar6 - (int)lVar10;
        }
      }
    }
    else {
switchD_0016f87e_default:
      uVar7 = 0xffffffff;
    }
    break;
  case 0x18:
    bVar16 = (long)(short)uVar9 == uVar9;
    goto joined_r0x0016f8ec;
  case 0x19:
    bVar16 = uVar9 < 0x10000;
joined_r0x0016f8ec:
    uVar7 = 0xffffffff;
    if (((bool)(bVar11 & bVar16)) && (uVar7 = 0xffffffff, local_48 != iVar13)) {
      lVar10 = (long)local_48;
      do {
        if (*(short *)(*(long *)((long)local_38.ptr + 0x38) + lVar10 * 2) == (short)uVar9)
        goto LAB_0016faa7;
        lVar10 = lVar10 + lVar12;
      } while (iVar13 != (int)lVar10);
LAB_0016fa30:
      uVar7 = 0xffffffff;
    }
    break;
  case 0x1a:
    bVar16 = (long)(int)uVar8 == uVar9;
    goto joined_r0x0016fa09;
  case 0x1b:
    bVar16 = uVar9 >> 0x20 == 0;
joined_r0x0016fa09:
    uVar7 = 0xffffffff;
    if ((!(bool)(bVar11 & bVar16)) || (uVar7 = 0xffffffff, local_48 == iVar13)) break;
    lVar10 = (long)local_48;
    do {
      if (*(uint *)(*(long *)((long)local_38.ptr + 0x38) + lVar10 * 4) == uVar8) goto LAB_0016faa7;
      lVar10 = lVar10 + lVar12;
    } while (iVar13 != (int)lVar10);
    goto LAB_0016fa30;
  case 0x1c:
    if (NAN(local_40)) {
      if (special != -1) goto LAB_0016fb1d;
      uVar7 = 0xffffffff;
      if (local_48 != iVar13) {
        lVar10 = (long)local_48;
        do {
          if (NAN(*(float *)(*(long *)((long)local_38.ptr + 0x38) + lVar10 * 4))) goto LAB_0016fb54;
          lVar10 = lVar10 + lVar12;
        } while (iVar13 != (int)lVar10);
LAB_0016fb4d:
        uVar7 = 0xffffffff;
      }
LAB_0016fb56:
      iVar3 = 0;
LAB_0016fb5c:
      if ((iVar3 != 0) && (iVar3 != 3)) {
        JVar15.float64 = 0.0;
        goto LAB_0016f920;
      }
    }
    else {
      fVar17 = (float)local_40;
      uVar7 = 0xffffffff;
      if (((local_40 == (double)fVar17) && (!NAN(local_40) && !NAN((double)fVar17))) &&
         (local_48 != iVar13)) {
        lVar10 = (long)local_48;
        do {
          fVar1 = *(float *)(*(long *)((long)local_38.ptr + 0x38) + lVar10 * 4);
          if ((fVar1 == fVar17) && (!NAN(fVar1) && !NAN(fVar17))) goto LAB_0016fab2;
          lVar10 = lVar10 + lVar12;
        } while (iVar13 != (int)lVar10);
LAB_0016fa71:
        uVar7 = 0xffffffff;
      }
    }
    break;
  case 0x1d:
    if (NAN(local_40)) {
      if (special == -1) {
        uVar7 = 0xffffffff;
        if (local_48 != iVar13) {
          lVar10 = (long)local_48;
          do {
            if (NAN(*(double *)(*(long *)((long)local_38.ptr + 0x38) + lVar10 * 8)))
            goto LAB_0016fb54;
            lVar10 = lVar10 + lVar12;
          } while (iVar13 != (int)lVar10);
          goto LAB_0016fb4d;
        }
        goto LAB_0016fb56;
      }
LAB_0016fb1d:
      iVar3 = 3;
      uVar7 = 0xffffffff;
      goto LAB_0016fb5c;
    }
    uVar7 = 0xffffffff;
    if (local_48 != iVar13) {
      lVar10 = (long)local_48;
      do {
        dVar2 = *(double *)(*(long *)((long)local_38.ptr + 0x38) + lVar10 * 8);
        if ((dVar2 == local_40) && (!NAN(dVar2) && !NAN(local_40))) goto LAB_0016fab2;
        lVar10 = lVar10 + lVar12;
      } while (iVar13 != (int)lVar10);
      goto LAB_0016fa71;
    }
    break;
  default:
    goto switchD_0016f87e_default;
  }
  goto LAB_0016f904;
LAB_0016fb54:
  uVar7 = (uint)lVar10;
  goto LAB_0016fb56;
LAB_0016fab2:
  uVar7 = (uint)lVar10;
  goto LAB_0016f904;
LAB_0016faa7:
  uVar7 = (uint)lVar10;
LAB_0016f904:
  if (special == -1) {
    JVar15._1_7_ = 0;
    JVar15.int32._0_1_ = -1 < (int)uVar7;
    iVar14 = 1;
  }
  else {
    JVar15._4_4_ = 0;
    JVar15.int32 = uVar7;
    iVar14 = 0;
  }
LAB_0016f920:
  JVar18.tag = iVar14;
  JVar18.u.float64 = JVar15.float64;
  return JVar18;
}

Assistant:

static JSValue js_typed_array_indexOf(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int special)
{
    JSObject *p;
    int len, tag, is_int, is_bigint, k, stop, inc, res = -1;
    int64_t v64;
    double d;
    float f;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;
    if (len == 0)
        goto done;

    if (special == special_lastIndexOf) {
        k = len - 1;
        if (argc > 1) {
            if (JS_ToFloat64(ctx, &d, argv[1]))
                goto exception;
            if (isnan(d)) {
                k = 0;
            } else {
                if (d >= 0) {
                    if (d < k) {
                        k = d;
                    }
                } else {
                    d += len;
                    if (d < 0)
                        goto done;
                    k = d;
                }
            }
        }
        stop = -1;
        inc = -1;
    } else {
        k = 0;
        if (argc > 1) {
            if (JS_ToInt32Clamp(ctx, &k, argv[1], 0, len, len))
                goto exception;
        }
        stop = len;
        inc = 1;
    }

    p = JS_VALUE_GET_OBJ(this_val);
    /* if the array was detached, no need to go further (but no
       exception is raised) */
    if (typed_array_is_detached(ctx, p)) {
        /* "includes" scans all the properties, so "undefined" can match */
        if (special == special_includes && JS_IsUndefined(argv[0]) && len > 0)
            res = 0;
        goto done;
    }
    
    is_bigint = 0;
    is_int = 0; /* avoid warning */
    v64 = 0; /* avoid warning */
    tag = JS_VALUE_GET_NORM_TAG(argv[0]);
    if (tag == JS_TAG_INT) {
        is_int = 1;
        v64 = JS_VALUE_GET_INT(argv[0]);
        d = v64;
    } else
    if (tag == JS_TAG_FLOAT64) {
        d = JS_VALUE_GET_FLOAT64(argv[0]);
        v64 = d;
        is_int = (v64 == d);
    } else
#ifdef CONFIG_BIGNUM
    if (tag == JS_TAG_BIG_INT) {
        JSBigFloat *p1 = JS_VALUE_GET_PTR(argv[0]);
        
        if (p->class_id == JS_CLASS_BIG_INT64_ARRAY) {
            if (bf_get_int64(&v64, &p1->num, 0) != 0)
                goto done;
        } else if (p->class_id == JS_CLASS_BIG_UINT64_ARRAY) {
            if (bf_get_uint64((uint64_t *)&v64, &p1->num) != 0)
                goto done;
        } else {
            goto done;
        }
        d = 0;
        is_bigint = 1;
    } else
#endif
    {
        goto done;
    }

    switch (p->class_id) {
    case JS_CLASS_INT8_ARRAY:
        if (is_int && (int8_t)v64 == v64)
            goto scan8;
        break;
    case JS_CLASS_UINT8C_ARRAY:
    case JS_CLASS_UINT8_ARRAY:
        if (is_int && (uint8_t)v64 == v64) {
            const uint8_t *pv, *pp;
            uint16_t v;
        scan8:
            pv = p->u.array.u.uint8_ptr;
            v = v64;
            if (inc > 0) {
                pp = memchr(pv + k, v, len - k);
                if (pp)
                    res = pp - pv;
            } else {
                for (; k != stop; k += inc) {
                    if (pv[k] == v) {
                        res = k;
                        break;
                    }
                }
            }
        }
        break;
    case JS_CLASS_INT16_ARRAY:
        if (is_int && (int16_t)v64 == v64)
            goto scan16;
        break;
    case JS_CLASS_UINT16_ARRAY:
        if (is_int && (uint16_t)v64 == v64) {
            const uint16_t *pv;
            uint16_t v;
        scan16:
            pv = p->u.array.u.uint16_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_INT32_ARRAY:
        if (is_int && (int32_t)v64 == v64)
            goto scan32;
        break;
    case JS_CLASS_UINT32_ARRAY:
        if (is_int && (uint32_t)v64 == v64) {
            const uint32_t *pv;
            uint32_t v;
        scan32:
            pv = p->u.array.u.uint32_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_FLOAT32_ARRAY:
        if (is_bigint)
            break;
        if (isnan(d)) {
            const float *pv = p->u.array.u.float_ptr;
            /* special case: indexOf returns -1, includes finds NaN */
            if (special != special_includes)
                goto done;
            for (; k != stop; k += inc) {
                if (isnan(pv[k])) {
                    res = k;
                    break;
                }
            }
        } else if ((f = (float)d) == d) {
            const float *pv = p->u.array.u.float_ptr;
            for (; k != stop; k += inc) {
                if (pv[k] == f) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_FLOAT64_ARRAY:
        if (is_bigint)
            break;
        if (isnan(d)) {
            const double *pv = p->u.array.u.double_ptr;
            /* special case: indexOf returns -1, includes finds NaN */
            if (special != special_includes)
                goto done;
            for (; k != stop; k += inc) {
                if (isnan(pv[k])) {
                    res = k;
                    break;
                }
            }
        } else {
            const double *pv = p->u.array.u.double_ptr;
            for (; k != stop; k += inc) {
                if (pv[k] == d) {
                    res = k;
                    break;
                }
            }
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_CLASS_BIG_INT64_ARRAY:
        if (is_bigint || (is_math_mode(ctx) && is_int &&
                          v64 >= -MAX_SAFE_INTEGER &&
                          v64 <= MAX_SAFE_INTEGER)) {
            goto scan64;
        }
        break;
    case JS_CLASS_BIG_UINT64_ARRAY:
        if (is_bigint || (is_math_mode(ctx) && is_int &&
                          v64 >= 0 && v64 <= MAX_SAFE_INTEGER)) {
            const uint64_t *pv;
            uint64_t v;
        scan64:
            pv = p->u.array.u.uint64_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
#endif
    }

done:
    if (special == special_includes)
        return JS_NewBool(ctx, res >= 0);
    else
        return JS_NewInt32(ctx, res);

exception:
    return JS_EXCEPTION;
}